

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O0

void __thiscall
icu_63::double_conversion::GenerateCountedDigits
          (double_conversion *this,int count,int *decimal_point,Bignum *numerator,
          Bignum *denominator,Vector<char> buffer,int *length)

{
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  int iVar4;
  int local_44;
  char local_40;
  int i_1;
  uint16_t digit;
  uint16_t digit_1;
  int i;
  Bignum *denominator_local;
  Bignum *numerator_local;
  int *decimal_point_local;
  undefined1 auStack_18 [4];
  int count_local;
  Vector<char> buffer_local;
  
  buffer_local.start_._0_4_ = SUB84(length,0);
  iVar4 = (int)this;
  _auStack_18 = denominator;
  for (i_1 = 0; i_1 < iVar4 + -1; i_1 = i_1 + 1) {
    uVar1 = Bignum::DivideModuloIntBignum((Bignum *)decimal_point,numerator);
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,i_1);
    *pcVar3 = (char)uVar1 + '0';
    Bignum::Times10((Bignum *)decimal_point);
  }
  uVar1 = Bignum::DivideModuloIntBignum((Bignum *)decimal_point,numerator);
  local_40 = (char)uVar1;
  iVar2 = Bignum::PlusCompare((Bignum *)decimal_point,(Bignum *)decimal_point,numerator);
  if (-1 < iVar2) {
    local_40 = local_40 + '\x01';
  }
  pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,iVar4 + -1);
  *pcVar3 = local_40 + '0';
  iVar2 = iVar4;
  while ((local_44 = iVar2 + -1, 0 < local_44 &&
         (pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,local_44), *pcVar3 == ':')))
  {
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,local_44);
    *pcVar3 = '0';
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,iVar2 + -2);
    *pcVar3 = *pcVar3 + '\x01';
    iVar2 = local_44;
  }
  pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,0);
  if (*pcVar3 == ':') {
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,0);
    *pcVar3 = '1';
    *(int *)CONCAT44(in_register_00000034,count) = *(int *)CONCAT44(in_register_00000034,count) + 1;
  }
  *(int *)buffer.start_ = iVar4;
  return;
}

Assistant:

static void GenerateCountedDigits(int count, int* decimal_point,
                                  Bignum* numerator, Bignum* denominator,
                                  Vector<char> buffer, int* length) {
  ASSERT(count >= 0);
  for (int i = 0; i < count - 1; ++i) {
    uint16_t digit;
    digit = numerator->DivideModuloIntBignum(*denominator);
    ASSERT(digit <= 9);  // digit is a uint16_t and therefore always positive.
    // digit = numerator / denominator (integer division).
    // numerator = numerator % denominator.
    buffer[i] = static_cast<char>(digit + '0');
    // Prepare for next iteration.
    numerator->Times10();
  }
  // Generate the last digit.
  uint16_t digit;
  digit = numerator->DivideModuloIntBignum(*denominator);
  if (Bignum::PlusCompare(*numerator, *numerator, *denominator) >= 0) {
    digit++;
  }
  ASSERT(digit <= 10);
  buffer[count - 1] = static_cast<char>(digit + '0');
  // Correct bad digits (in case we had a sequence of '9's). Propagate the
  // carry until we hat a non-'9' or til we reach the first digit.
  for (int i = count - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) break;
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  if (buffer[0] == '0' + 10) {
    // Propagate a carry past the top place.
    buffer[0] = '1';
    (*decimal_point)++;
  }
  *length = count;
}